

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktDrawTestCaseUtil.hpp
# Opt level: O0

void __thiscall
vkt::Draw::
InstanceFactory<vkt::Draw::(anonymous_namespace)::IndirectDrawInstanced<vkt::Draw::(anonymous_namespace)::FirtsInstanceSupported>_>
::InstanceFactory(InstanceFactory<vkt::Draw::(anonymous_namespace)::IndirectDrawInstanced<vkt::Draw::(anonymous_namespace)::FirtsInstanceSupported>_>
                  *this,TestContext *testCtx,string *name,string *desc,TestSpec *testSpec)

{
  TestSpec *testSpec_local;
  string *desc_local;
  string *name_local;
  TestContext *testCtx_local;
  InstanceFactory<vkt::Draw::(anonymous_namespace)::IndirectDrawInstanced<vkt::Draw::(anonymous_namespace)::FirtsInstanceSupported>_>
  *this_local;
  
  TestCase::TestCase(&this->super_TestCase,testCtx,name,desc);
  (this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__InstanceFactory_016adbd0;
  Draw::anon_unknown_0::DrawTypedTestSpec::DrawTypedTestSpec(&this->m_testSpec,testSpec);
  return;
}

Assistant:

InstanceFactory (tcu::TestContext& testCtx, const std::string& name, const std::string& desc, typename Instance::TestSpec testSpec)
		: TestCase		(testCtx, name, desc)
		, m_testSpec	(testSpec)
	{
	}